

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unity.c
# Opt level: O3

void UnityPrintNumberHex(UNITY_UINT number,char nibbles_to_print)

{
  uint uVar1;
  byte bVar2;
  int __c;
  long lVar3;
  ulong uVar4;
  
  if (nibbles_to_print != '\0') {
    bVar2 = 0x10;
    if ((byte)nibbles_to_print < 0x10) {
      bVar2 = nibbles_to_print;
    }
    lVar3 = (ulong)bVar2 * 4;
    uVar4 = (ulong)bVar2 + 1;
    do {
      lVar3 = lVar3 + -4;
      uVar1 = (uint)(number >> ((byte)lVar3 & 0x3f)) & 0xf;
      __c = uVar1 + 0x30;
      if (9 < uVar1) {
        __c = uVar1 + 0x37;
      }
      putchar(__c);
      uVar4 = uVar4 - 1;
    } while (1 < uVar4);
  }
  return;
}

Assistant:

void UnityPrintNumberHex(const UNITY_UINT number, const char nibbles_to_print)
{
    int nibble;
    char nibbles = nibbles_to_print;

    if ((unsigned)nibbles > UNITY_MAX_NIBBLES)
    {
        nibbles = UNITY_MAX_NIBBLES;
    }

    while (nibbles > 0)
    {
        nibbles--;
        nibble = (int)(number >> (nibbles * 4)) & 0x0F;
        if (nibble <= 9)
        {
            UNITY_OUTPUT_CHAR((char)('0' + nibble));
        }
        else
        {
            UNITY_OUTPUT_CHAR((char)('A' - 10 + nibble));
        }
    }
}